

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

bool duckdb::ColumnDataCollection::ResultEquals
               (ColumnDataCollection *left,ColumnDataCollection *right,string *error_message,
               bool ordered)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  bool bVar2;
  iterator __it;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  idx_t iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  Value rvalue;
  Value lvalue;
  ColumnDataRowCollection right_rows;
  ColumnDataRowCollection left_rows;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  string local_270;
  string local_250;
  undefined1 local_230 [32];
  Value local_210;
  Value local_1d0;
  ColumnDataRowCollection local_190;
  ColumnDataRowCollection local_e0;
  
  if ((long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(right->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (left->count == right->count) {
      ColumnDataRowCollection::ColumnDataRowCollection(&local_e0,left);
      ColumnDataRowCollection::ColumnDataRowCollection(&local_190,right);
      if (left->count == 0) {
        if (error_message->_M_string_length != 0) {
LAB_012c875f:
          if ((left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
            iVar5 = 0;
            do {
              local_210.type_._0_8_ = &local_210.value_info_;
              local_210.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&DAT_00000001;
              local_210.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_210._24_8_ = 0;
              local_210.value_.integer = 0x3f800000;
              local_210.value_.hugeint.upper = 0;
              local_210.value_info_.internal.
              super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if (left->count != 0) {
                iVar6 = 0;
                do {
                  ColumnDataRowCollection::GetValue(&local_1d0,&local_e0,iVar5,iVar6);
                  local_230._0_8_ =
                       (_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                        *)&local_210;
                  ::std::
                  _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueResultEquals,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                  ::
                  _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                            ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueResultEquals,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                              *)&local_210,0,&local_1d0,local_230);
                  Value::~Value(&local_1d0);
                  iVar6 = iVar6 + 1;
                } while (iVar6 < left->count);
              }
              if (right->count != 0) {
                iVar6 = 0;
                do {
                  ColumnDataRowCollection::GetValue(&local_1d0,&local_190,iVar5,iVar6);
                  __it = ::std::
                         _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                         ::find((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                                 *)&local_210,&local_1d0);
                  if (__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur ==
                      (__node_type *)0x0) {
                    Value::~Value(&local_1d0);
                    ::std::
                    _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                    ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                                   *)&local_210);
                    goto LAB_012c88d9;
                  }
                  ::std::
                  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                  ::erase((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                           *)&local_210,
                          (const_iterator)__it.super__Node_iterator_base<duckdb::Value,_true>._M_cur
                         );
                  Value::~Value(&local_1d0);
                  iVar6 = iVar6 + 1;
                } while (iVar6 < right->count);
              }
              ::std::
              _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
              ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                             *)&local_210);
              iVar5 = iVar5 + 1;
            } while (iVar5 < (ulong)(((long)(left->types).
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            .
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(left->types).
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            .
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555));
          }
          pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                    &local_1d0.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          local_1d0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1d0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_1_ = 0;
          local_1d0.type_._0_8_ = pp_Var1;
          ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_1d0);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1d0.type_._0_8_ != pp_Var1) {
            operator_delete((void *)local_1d0.type_._0_8_);
          }
        }
LAB_012c88bb:
        bVar2 = true;
      }
      else {
        params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_012c859c:
        if ((left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (left->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) {
          iVar5 = 0;
          do {
            ColumnDataRowCollection::GetValue(&local_1d0,&local_e0,iVar5,(idx_t)params_1);
            ColumnDataRowCollection::GetValue(&local_210,&local_190,iVar5,(idx_t)params_1);
            bVar2 = Value::DefaultValuesAreEqual(&local_1d0,&local_210);
            if (!bVar2) {
              local_290[0] = local_280;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_290,"%s <> %s (row: %lld, col: %lld)\n","");
              Value::ToString_abi_cxx11_(&local_250,&local_1d0);
              Value::ToString_abi_cxx11_(&local_270,&local_210);
              StringUtil::
              Format<std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
                        ((string *)local_230,(StringUtil *)local_290,&local_250,&local_270,params_1,
                         iVar5,(unsigned_long)error_message);
              ::std::__cxx11::string::operator=((string *)error_message,(string *)local_230);
              if ((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                   *)local_230._0_8_ !=
                  (_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueResultEquals,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                   *)(local_230 + 0x10)) {
                operator_delete((void *)local_230._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != &local_270.field_2) {
                operator_delete(local_270._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p);
              }
              if (local_290[0] != local_280) {
                operator_delete(local_290[0]);
              }
              Value::~Value(&local_210);
              Value::~Value(&local_1d0);
              break;
            }
            Value::~Value(&local_210);
            Value::~Value(&local_1d0);
            iVar5 = iVar5 + 1;
          } while (iVar5 < (ulong)(((long)(left->types).
                                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          .
                                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(left->types).
                                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          .
                                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  -0x5555555555555555));
        }
        if (error_message->_M_string_length == 0) {
          params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(params_1->_M_dataplus)._M_p + 1);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)left->count <=
              params_1) goto LAB_012c88bb;
          goto LAB_012c859c;
        }
        if (!ordered) goto LAB_012c875f;
LAB_012c88d9:
        bVar2 = false;
      }
      if (local_190.scan_state.column_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_190.scan_state);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::~vector(&local_190.chunks.
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
      if (local_190.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
          .super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.rows.
                        super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                        super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
          .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_e0.scan_state);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::~vector(&local_e0.chunks.
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
      if (local_e0.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
          super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.rows.
                        super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                        super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return bVar2;
    }
    pcVar4 = (char *)error_message->_M_string_length;
    pcVar3 = "Row count mismatch";
  }
  else {
    pcVar4 = (char *)error_message->_M_string_length;
    pcVar3 = "Column count mismatch";
  }
  ::std::__cxx11::string::_M_replace((ulong)error_message,0,pcVar4,(ulong)pcVar3);
  return false;
}

Assistant:

bool ColumnDataCollection::ResultEquals(const ColumnDataCollection &left, const ColumnDataCollection &right,
                                        string &error_message, bool ordered) {
	if (left.ColumnCount() != right.ColumnCount()) {
		error_message = "Column count mismatch";
		return false;
	}
	if (left.Count() != right.Count()) {
		error_message = "Row count mismatch";
		return false;
	}
	auto left_rows = left.GetRows();
	auto right_rows = right.GetRows();
	for (idx_t r = 0; r < left.Count(); r++) {
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			auto lvalue = left_rows.GetValue(c, r);
			auto rvalue = right_rows.GetValue(c, r);

			if (!Value::DefaultValuesAreEqual(lvalue, rvalue)) {
				error_message =
				    StringUtil::Format("%s <> %s (row: %lld, col: %lld)\n", lvalue.ToString(), rvalue.ToString(), r, c);
				break;
			}
		}
		if (!error_message.empty()) {
			if (ordered) {
				return false;
			} else {
				break;
			}
		}
	}
	if (!error_message.empty()) {
		// do an unordered comparison
		bool found_all = true;
		for (idx_t c = 0; c < left.ColumnCount(); c++) {
			std::unordered_multiset<Value, ValueHashFunction, ValueResultEquals> lvalues;
			for (idx_t r = 0; r < left.Count(); r++) {
				auto lvalue = left_rows.GetValue(c, r);
				lvalues.insert(lvalue);
			}
			for (idx_t r = 0; r < right.Count(); r++) {
				auto rvalue = right_rows.GetValue(c, r);
				auto entry = lvalues.find(rvalue);
				if (entry == lvalues.end()) {
					found_all = false;
					break;
				}
				lvalues.erase(entry);
			}
			if (!found_all) {
				break;
			}
		}
		if (!found_all) {
			return false;
		}
		error_message = string();
	}
	return true;
}